

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

NFABaseState<unsigned_char,_int> * __thiscall
Centaurus::NFABaseState<unsigned_char,_int>::offset
          (NFABaseState<unsigned_char,_int> *__return_storage_ptr__,
          NFABaseState<unsigned_char,_int> *this,int value)

{
  bool bVar1;
  NFATransition<unsigned_char> local_78;
  reference local_40;
  NFATransition<unsigned_char> *transition;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *__range2;
  int value_local;
  NFABaseState<unsigned_char,_int> *this_local;
  NFABaseState<unsigned_char,_int> *new_state;
  
  NFABaseState(__return_storage_ptr__);
  __end0 = std::
           vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ::begin(&this->m_transitions);
  transition = (NFATransition<unsigned_char> *)
               std::
               vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
               ::end(&this->m_transitions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                                     *)&transition), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
               ::operator*(&__end0);
    NFATransition<unsigned_char>::offset(&local_78,local_40,value);
    add_transition(__return_storage_ptr__,&local_78);
    NFATransition<unsigned_char>::~NFATransition(&local_78);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

NFABaseState<TCHAR, TLABEL> offset(int value) const
    {
        NFABaseState<TCHAR, TLABEL> new_state;

        for (const auto& transition : m_transitions)
        {
            new_state.add_transition(transition.offset(value));
        }

        return new_state;
    }